

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

int Kit_TruthXorCount(uint *pTruth0,uint *pTruth1,int nVars)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar1 = (char)nVars - 5U & 0x1f;
  uVar4 = 0;
  uVar5 = (ulong)(uint)(1 << bVar1);
  if (1 << bVar1 < 1) {
    uVar5 = uVar4;
  }
  if (nVars < 6) {
    uVar5 = 1;
  }
  iVar3 = 0;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar2 = Kit_WordCountOnes(pTruth1[uVar4] ^ pTruth0[uVar4]);
    iVar3 = iVar3 + iVar2;
  }
  return iVar3;
}

Assistant:

int Kit_TruthXorCount( unsigned * pTruth0, unsigned * pTruth1, int nVars )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, Counter = 0;
    for ( i = 0; i < nWords; i++ )
        Counter += Kit_WordCountOnes( pTruth0[i] ^ pTruth1[i] );
    return Counter;
}